

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O2

void raster_size(char *fn,int num,int *x,int *y)

{
  int iVar1;
  ssize_t sVar2;
  raster_t hd;
  string s2;
  string s1;
  
  sprintf(s1,"%d",num);
  concat(fn,s1,s2);
  iVar1 = open(s2,0);
  if (iVar1 < 1) {
    iVar1 = 6;
LAB_00102b8e:
    error(iVar1);
  }
  sVar2 = read(iVar1,&hd,0x20);
  if (sVar2 == 0x20) {
    *x = hd.width;
    *y = hd.height;
    if ((0x13c < *x) || (0x13c < hd.height)) {
      iVar1 = 10;
      goto LAB_00102b8e;
    }
  }
  close(iVar1);
  return;
}

Assistant:

void raster_size(fn,num,x,y)
char *fn ;
int num, *x, *y ;

{ raster_t hd ;
  string s1, s2 ;
  int fd ;

  sprintf(s1,"%d",num);
  concat(fn,s1,s2) ;
  if ((fd = open(s2,O_RDONLY)) > 0) {
    if (read(fd,&hd,sizeof(hd)) == sizeof(hd)) {
      *x = hd.width ;
      *y = hd.height ;
      if (*x > X || *y > Y) {
        error(10) ;
      }
    }
  }
  else {
    error(6) ;
  }
  close(fd) ;
}